

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xml_allocator::deallocate_memory
          (xml_allocator *this,void *ptr,size_t size,xml_memory_page *page)

{
  xml_memory_page *pxVar1;
  ulong uVar2;
  ulong uVar3;
  
  pxVar1 = this->_root;
  if (pxVar1 == page) {
    page->busy_size = this->_busy_size;
  }
  if (page + 1 <= ptr) {
    uVar2 = page->busy_size;
    if (ptr < (void *)((long)&page[1].allocator + uVar2)) {
      uVar3 = size + page->freed_size;
      page->freed_size = uVar3;
      if (uVar2 < uVar3) {
        __assert_fail("page->freed_size <= page->busy_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x259,
                      "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
                     );
      }
      if (uVar3 == uVar2) {
        if (page->next != (xml_memory_page *)0x0) {
          if (pxVar1 == page) {
            __assert_fail("_root != page",
                          "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                          ,0x270,
                          "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
                         );
          }
          pxVar1 = page->prev;
          if (pxVar1 != (xml_memory_page *)0x0) {
            pxVar1->next = page->next;
            page->next->prev = pxVar1;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )(page);
            return;
          }
          __assert_fail("page->prev",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                        ,0x271,
                        "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
                       );
        }
        if (pxVar1 != page) {
          __assert_fail("_root == page",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                        ,0x25f,
                        "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
                       );
        }
        page->busy_size = 0;
        page->freed_size = 0;
        this->_busy_size = 0;
      }
      return;
    }
  }
  __assert_fail("ptr >= reinterpret_cast<char*>(page) + sizeof(xml_memory_page) && ptr < reinterpret_cast<char*>(page) + sizeof(xml_memory_page) + page->busy_size"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                ,0x255,
                "void pugi::impl::(anonymous namespace)::xml_allocator::deallocate_memory(void *, size_t, xml_memory_page *)"
               );
}

Assistant:

void deallocate_memory(void* ptr, size_t size, xml_memory_page* page)
		{
			if (page == _root) page->busy_size = _busy_size;

			assert(ptr >= reinterpret_cast<char*>(page) + sizeof(xml_memory_page) && ptr < reinterpret_cast<char*>(page) + sizeof(xml_memory_page) + page->busy_size);
			(void)!ptr;

			page->freed_size += size;
			assert(page->freed_size <= page->busy_size);

			if (page->freed_size == page->busy_size)
			{
				if (page->next == 0)
				{
					assert(_root == page);

					// top page freed, just reset sizes
					page->busy_size = 0;
					page->freed_size = 0;

				#ifdef PUGIXML_COMPACT
					// reset compact state to maximize efficiency
					page->compact_string_base = 0;
					page->compact_shared_parent = 0;
					page->compact_page_marker = 0;
				#endif

					_busy_size = 0;
				}
				else
				{
					assert(_root != page);
					assert(page->prev);

					// remove from the list
					page->prev->next = page->next;
					page->next->prev = page->prev;

					// deallocate
					deallocate_page(page);
				}
			}
		}